

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_hrefk(jit_State *J)

{
  IRType1 *pIVar1;
  ushort uVar2;
  IRIns *pIVar3;
  int iVar4;
  AliasRet AVar5;
  int iVar6;
  TRef TVar7;
  TRef unaff_EBP;
  ulong uVar8;
  uint lim;
  
  uVar2 = (J->fold).left[0].field_0.op1;
  lim = (uint)J->chain[0x3b];
  do {
    if (lim <= uVar2) {
      if ((*(char *)((long)(J->cur).ir + (ulong)uVar2 * 8 + 5) == 'R') &&
         (iVar6 = fwd_aa_tab_clear(J,(uint)uVar2,(uint)uVar2), iVar6 != 0)) {
        pIVar1 = &(J->fold).ins.field_1.t;
        pIVar1->irt = pIVar1->irt & 0x7f;
      }
      goto LAB_0011c94a;
    }
    pIVar3 = (J->cur).ir;
    uVar8 = (ulong)lim;
    TVar7 = unaff_EBP;
    if (uVar2 == pIVar3[uVar8].field_0.op1) {
      if ((J->fold).right[0].field_0.op1 == *(IRRef1 *)((long)pIVar3 + uVar8 * 8 + 2)) {
        iVar4 = fwd_aa_tab_clear(J,lim,(uint)uVar2);
        iVar6 = 1;
        TVar7 = lim;
        if (iVar4 != 0) goto LAB_0011c90b;
      }
      iVar6 = 4;
      TVar7 = unaff_EBP;
    }
    else {
      AVar5 = aa_table(J,(uint)uVar2,(uint)pIVar3[uVar8].field_0.op1);
      iVar6 = 4;
      if (AVar5 == ALIAS_NO) {
        lim = (uint)*(ushort *)((long)pIVar3 + uVar8 * 8 + 6);
        iVar6 = 0;
      }
    }
LAB_0011c90b:
    unaff_EBP = TVar7;
  } while (iVar6 == 0);
  if (iVar6 != 4) {
    return TVar7;
  }
LAB_0011c94a:
  TVar7 = lj_opt_cse(J);
  return TVar7;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_hrefk(jit_State *J)
{
  IRRef tab = fleft->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > tab) {
    IRIns *newref = IR(ref);
    if (tab == newref->op1) {
      if (fright->op1 == newref->op2 && fwd_aa_tab_clear(J, ref, tab))
	return ref;  /* Forward from NEWREF. */
      else
	goto docse;
    } else if (aa_table(J, tab, newref->op1) != ALIAS_NO) {
      goto docse;
    }
    ref = newref->prev;
  }
  /* No conflicting NEWREF: key location unchanged for HREFK of TDUP. */
  if (IR(tab)->o == IR_TDUP && fwd_aa_tab_clear(J, tab, tab))
    fins->t.irt &= ~IRT_GUARD;  /* Drop HREFK guard. */
docse:
  return CSEFOLD;
}